

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

void __thiscall
pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>::ParamArray
          (ParamArray<pbrt::syntactic::Texture> *this,string *type)

{
  (this->super_Param).super_enable_shared_from_this<pbrt::syntactic::Param>._M_weak_this.
  super___weak_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Param).super_enable_shared_from_this<pbrt::syntactic::Param>._M_weak_this.
  super___weak_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Param)._vptr_Param = (_func_int **)&PTR_getType_abi_cxx11__00168e50;
  std::__cxx11::string::string((string *)&this->type,(string *)type);
  (this->texture).super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->texture).super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

virtual std::string getType() const { return type; }